

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void put8bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  ppuVar2 = img->PALmap;
  uVar1 = img->samplesperpixel;
  while (bVar5 = h != 0, h = h - 1, bVar5) {
    lVar4 = (long)toskew * -4;
    for (lVar3 = 0; w != (uint32_t)lVar3; lVar3 = lVar3 + 1) {
      cp[lVar3] = *ppuVar2[*pp];
      pp = pp + uVar1;
      lVar4 = lVar4 + -4;
    }
    cp = (uint32_t *)((long)cp - lVar4);
    pp = pp + fromskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put8bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;
    int samplesperpixel = img->samplesperpixel;

    (void)y;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = PALmap[*pp][0];
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}